

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iremga20.c
# Opt level: O1

void iremga20_alloc_rom(void *info,UINT32 memsize)

{
  void *__s;
  ga20_state *chip;
  
  if (*(UINT32 *)((long)info + 0x10) == memsize) {
    return;
  }
  __s = realloc(*(void **)((long)info + 8),(ulong)memsize);
  *(void **)((long)info + 8) = __s;
  *(UINT32 *)((long)info + 0x10) = memsize;
  memset(__s,0xff,(ulong)memsize);
  return;
}

Assistant:

static void iremga20_alloc_rom(void* info, UINT32 memsize)
{
	ga20_state *chip = (ga20_state *)info;
	
	if (chip->rom_size == memsize)
		return;
	
	chip->rom = (UINT8*)realloc(chip->rom, memsize);
	chip->rom_size = memsize;
	memset(chip->rom, 0xFF, memsize);
	
	return;
}